

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_efficiency.cpp
# Opt level: O2

variables_map * parse_cmdargs(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  size_type sVar3;
  ostream *poVar4;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  allocator<char> local_f1;
  basic_parsed_options<char> local_f0;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  options_description desc;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,argc);
  boost::program_options::variables_map::variables_map(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"Allowed options",&local_f1);
  boost::program_options::options_description::options_description
            (&desc,(string *)&local_f0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&local_f0);
  local_f0.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_f0,"help,h");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"text,t");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  ptVar2->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"input,i",(char *)ptVar2);
  local_c8.super_function_base.vtable = (vtable_base *)0x0;
  local_c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_c8.super_function_base.functor._8_8_ = 0;
  local_c8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>(&local_f0,(int)argv,in_RDX,&desc,0,&local_c8);
  boost::program_options::store((basic_parsed_options *)&local_f0,this,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_f0.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"help",&local_f1);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(this + 0x10),(key_type *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (sVar3 == 0) {
    boost::program_options::notify(this);
    boost::program_options::options_description::~options_description(&desc);
    return this;
  }
  poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
  std::operator<<(poVar4,"\n");
  exit(0);
}

Assistant:

po::variables_map parse_cmdargs(int argc, char const* argv[])
{
    po::variables_map vm;
    po::options_description desc("Allowed options");
    // clang-format off
    desc.add_options()
        ("help,h", "produce help message")
        ("text,t", "text input (default is uint32_t binary)")
        ("input,i",po::value<std::string>()->required(), "the input dir");
    // clang-format on
    try {
        po::store(po::parse_command_line(argc, argv, desc), vm);
        if (vm.count("help")) {
            std::cout << desc << "\n";
            exit(EXIT_SUCCESS);
        }
        po::notify(vm);
    } catch (const po::required_option& e) {
        std::cout << desc;
        std::cerr << "Missing required option: " << e.what() << std::endl;
        exit(EXIT_FAILURE);
    } catch (po::error& e) {
        std::cout << desc;
        std::cerr << "Error parsing cmdargs: " << e.what() << std::endl;
        exit(EXIT_FAILURE);
    }

    return vm;
}